

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QAsn1Element>::moveAppend
          (QGenericArrayOps<QAsn1Element> *this,QAsn1Element *b,QAsn1Element *e)

{
  qsizetype *pqVar1;
  QAsn1Element *pQVar2;
  long lVar3;
  Data *pDVar4;
  char *pcVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QAsn1Element>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QAsn1Element>).size;
      pQVar2[lVar3].mType = b->mType;
      pDVar4 = (b->mValue).d.d;
      (b->mValue).d.d = (Data *)0x0;
      pQVar2[lVar3].mValue.d.d = pDVar4;
      pcVar5 = (b->mValue).d.ptr;
      (b->mValue).d.ptr = (char *)0x0;
      pQVar2[lVar3].mValue.d.ptr = pcVar5;
      qVar6 = (b->mValue).d.size;
      (b->mValue).d.size = 0;
      pQVar2[lVar3].mValue.d.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QAsn1Element>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }